

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeNext(sqlite3_vtab_cursor *pVtabCursor)

{
  int iVar1;
  RtreeCursor *in_RDI;
  int rc;
  sqlite3_stmt *unaff_retaddr;
  RtreeCursor *pCsr;
  RtreeCursor *in_stack_00000028;
  
  if (in_RDI->bAuxValid != '\0') {
    in_RDI->bAuxValid = '\0';
    sqlite3_reset(unaff_retaddr);
  }
  rtreeSearchPointPop(in_RDI);
  iVar1 = rtreeStepToLeaf(in_stack_00000028);
  return iVar1;
}

Assistant:

static int rtreeNext(sqlite3_vtab_cursor *pVtabCursor){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  int rc = SQLITE_OK;

  /* Move to the next entry that matches the configured constraints. */
  RTREE_QUEUE_TRACE(pCsr, "POP-Nx:");
  if( pCsr->bAuxValid ){
    pCsr->bAuxValid = 0;
    sqlite3_reset(pCsr->pReadAux);
  }
  rtreeSearchPointPop(pCsr);
  rc = rtreeStepToLeaf(pCsr);
  return rc;
}